

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O1

ssize_t __thiscall RoboClaw::read(RoboClaw *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  long lVar4;
  ssize_t sVar5;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var_00 [56];
  uint8_t value;
  undefined1 local_2d;
  int local_2c;
  double local_28;
  undefined1 auVar6 [64];
  
  lVar3 = std::chrono::_V2::steady_clock::now();
  auVar6._8_56_ = extraout_var_00;
  auVar6._0_8_ = extraout_XMM0_Qa;
  auVar1 = vcvtusi2sd_avx512f(auVar6._0_16_,__fd);
  local_28 = auVar1._0_8_;
  do {
    local_2c = 0;
    iVar2 = ioctl(this->m_serial,0x541b,&local_2c);
    sVar5 = CONCAT44(extraout_var,iVar2);
    if (local_2c != 0) {
      local_2d = 0;
      if (this->m_serial != 0) {
        sVar5 = ::read(this->m_serial,&local_2d,1);
      }
      return CONCAT71((int7)((ulong)sVar5 >> 8),local_2d);
    }
    lVar4 = std::chrono::_V2::steady_clock::now();
  } while (((double)(lVar4 - lVar3) * 1000.0) / 1000000000.0 < local_28);
  return CONCAT71((int7)((ulong)(lVar4 - lVar3) >> 8),0xff);
}

Assistant:

uint8_t RoboClaw::read(uint32_t timeout)
{
    if( m_serial )
    {
        auto start = std::chrono::steady_clock::now();

        // Empty buffer?
        while( !available() )
        {
            auto end = std::chrono::steady_clock::now();
            auto elapsed = end-start;
            if( elapsed.count() * 1000.0 / std::chrono::steady_clock::period().den >= timeout )
            {
                return -1;
            }
        }
        return read();
    }
}